

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O2

void __thiscall
SuiteDataDictionaryTests::TestreadFromDocument_MajorAttributeMissing::
TestreadFromDocument_MajorAttributeMissing(TestreadFromDocument_MajorAttributeMissing *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"readFromDocument_MajorAttributeMissing","DataDictionaryTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/DataDictionaryTestCase.cpp"
             ,0x4df);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031c090;
  return;
}

Assistant:

TEST(readFromDocument_MajorAttributeMissing) {
  DataDictionary dictionary;

  std::stringbuf buffer;
  std::string dictionaryXml = "<fix type='FIX' minor='2' servicepack='0'></fix>";
  buffer.sputn(dictionaryXml.c_str(), dictionaryXml.size());
  std::istream is(&buffer);

  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());
  pDoc->load(is);

  CHECK_THROW(dictionary.readFromDocument(pDoc);, ConfigError);
}